

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

char * js_strndup(JSContext *ctx,char *s,size_t n)

{
  char *__dest;
  
  __dest = (char *)js_malloc(ctx,n + 1);
  if (__dest != (char *)0x0) {
    memcpy(__dest,s,n);
    __dest[n] = '\0';
  }
  return __dest;
}

Assistant:

char *js_strndup(JSContext *ctx, const char *s, size_t n)
{
    char *ptr;
    ptr = js_malloc(ctx, n + 1);
    if (ptr) {
        memcpy(ptr, s, n);
        ptr[n] = '\0';
    }
    return ptr;
}